

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_watch_file(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = (uv_loop_t *)uv_default_loop();
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");
  iVar1 = uv_fs_event_init(loop,&fs_event);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_timer_init(loop,&timer);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        iVar1 = uv_timer_start(&timer,timer_cb_file,100);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          uv_run(loop,0);
          eval_a = 1;
          eval_b = (int64_t)fs_event_cb_called;
          if (eval_b == 1) {
            eval_a = 2;
            eval_b = (int64_t)timer_cb_called;
            if (eval_b == 2) {
              eval_a = 2;
              eval_b = (int64_t)close_cb_called;
              if (eval_b == 2) {
                remove("watch_dir/file2");
                remove("watch_dir/file1");
                remove("watch_dir/");
                close_loop(loop);
                eval_a = 0;
                iVar1 = uv_loop_close(loop);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(loop)";
                pcVar3 = "0";
                uVar2 = 0x259;
              }
              else {
                pcVar4 = "close_cb_called";
                pcVar3 = "2";
                uVar2 = 0x252;
              }
            }
            else {
              pcVar4 = "timer_cb_called";
              pcVar3 = "2";
              uVar2 = 0x251;
            }
          }
          else {
            pcVar4 = "fs_event_cb_called";
            pcVar3 = "1";
            uVar2 = 0x250;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x24c;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x24a;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x248;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x246;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  create_file("watch_dir/file1");
  create_file("watch_dir/file2");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event, fs_event_cb_file, "watch_dir/file2", 0);
  ASSERT_OK(r);
  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);
  r = uv_timer_start(&timer, timer_cb_file, 100, 100);
  ASSERT_OK(r);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(1, fs_event_cb_called);
  ASSERT_EQ(2, timer_cb_called);
  ASSERT_EQ(2, close_cb_called);

  /* Cleanup */
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}